

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageDocumentHelper::addPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *newpage,bool first)

{
  QPDF *this_00;
  undefined1 local_30 [31];
  bool first_local;
  QPDFPageObjectHelper *newpage_local;
  QPDFPageDocumentHelper *this_local;
  
  this_00 = (this->super_QPDFDocumentHelper).qpdf;
  local_30[0x17] = first;
  unique0x10000076 = (element_type *)newpage;
  newpage_local = (QPDFPageObjectHelper *)this;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_30);
  QPDF::addPage(this_00,(QPDFObjectHandle *)local_30,(bool)(local_30[0x17] & 1));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::addPage(QPDFPageObjectHelper newpage, bool first)
{
    this->qpdf.addPage(newpage.getObjectHandle(), first);
}